

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

int Curl_conncache_init(conncache *connc,int size)

{
  int iVar1;
  CURL *pCVar2;
  
  pCVar2 = curl_easy_init();
  connc->closure_handle = pCVar2;
  if (pCVar2 == (CURL *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = Curl_hash_init(&connc->hash,size,Curl_hash_str,Curl_str_key_compare,
                           free_bundle_hash_entry);
    if (iVar1 == 0) {
      (connc->closure_handle->state).conn_cache = connc;
    }
    else {
      Curl_close(connc->closure_handle);
      connc->closure_handle = (Curl_easy *)0x0;
    }
  }
  return iVar1;
}

Assistant:

int Curl_conncache_init(struct conncache *connc, int size)
{
  int rc;

  /* allocate a new easy handle to use when closing cached connections */
  connc->closure_handle = curl_easy_init();
  if(!connc->closure_handle)
    return 1; /* bad */

  rc = Curl_hash_init(&connc->hash, size, Curl_hash_str,
                      Curl_str_key_compare, free_bundle_hash_entry);
  if(rc) {
    Curl_close(connc->closure_handle);
    connc->closure_handle = NULL;
  }
  else
    connc->closure_handle->state.conn_cache = connc;

  return rc;
}